

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

uint32_t mp_decode_strl(char **data)

{
  byte bVar1;
  ushort uVar2;
  char *pcVar3;
  byte *pbVar4;
  uint uVar5;
  uint *in_RSI;
  
  pbVar4 = (byte *)*data;
  bVar1 = *pbVar4;
  *data = (char *)(pbVar4 + 1);
  if (bVar1 == 0xdb) {
    uVar5 = *(uint *)(pbVar4 + 1);
    *data = (char *)(pbVar4 + 5);
    return uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  }
  if (bVar1 == 0xda) {
    uVar2 = *(ushort *)(pbVar4 + 1);
    *data = (char *)(pbVar4 + 3);
    return (uint32_t)(ushort)(uVar2 << 8 | uVar2 >> 8);
  }
  if (bVar1 == 0xd9) {
    bVar1 = pbVar4[1];
    *data = (char *)(pbVar4 + 2);
    return (uint32_t)bVar1;
  }
  if (0xdf < (byte)(bVar1 + 0x40)) {
    return bVar1 & 0x1f;
  }
  mp_decode_strl_cold_1();
  if (in_RSI == (uint *)0x0) {
LAB_00118808:
    __assert_fail("len != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                  ,0x821,"const char *mp_decode_str(const char **, uint32_t *)");
  }
  pbVar4 = (byte *)*data;
  bVar1 = *pbVar4;
  *data = (char *)(pbVar4 + 1);
  if (bVar1 == 0xdb) {
    uVar5 = *(uint *)(pbVar4 + 1);
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    pbVar4 = pbVar4 + 5;
  }
  else {
    if (bVar1 == 0xda) {
      uVar2 = *(ushort *)(pbVar4 + 1);
      *data = (char *)(pbVar4 + 3);
      uVar5 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
      goto LAB_001187f4;
    }
    if (bVar1 != 0xd9) {
      if ((byte)(bVar1 + 0x40) < 0xe0) {
        mp_decode_str_cold_1();
        goto LAB_00118808;
      }
      uVar5 = bVar1 & 0x1f;
      goto LAB_001187f4;
    }
    uVar5 = (uint)pbVar4[1];
    pbVar4 = pbVar4 + 2;
  }
  *data = (char *)pbVar4;
LAB_001187f4:
  *in_RSI = uVar5;
  pcVar3 = *data;
  *data = pcVar3 + uVar5;
  return (uint32_t)pcVar3;
}

Assistant:

MP_IMPL uint32_t
mp_decode_strl(const char **data)
{
	uint8_t c = mp_load_u8(data);
	switch (c) {
	case 0xd9:
		return mp_load_u8(data);
	case 0xda:
		return mp_load_u16(data);
	case 0xdb:
		return mp_load_u32(data);
	default:
		if (mp_unlikely(c < 0xa0 || c > 0xbf))
			mp_unreachable();
		return c & 0x1f;
	}
}